

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O1

void DThinker::SaveList(FSerializer *arc,DThinker *node)

{
  byte bVar1;
  DThinker *in_RAX;
  DThinker *local_18;
  
  if (node != (DThinker *)0x0) {
    bVar1 = *(byte *)((long)&(node->super_DObject).ObjectFlags + 1);
    local_18 = in_RAX;
    while ((bVar1 & 4) == 0) {
      if ((node->NextThinker == (DThinker *)0x0) ||
         (((node->NextThinker->super_DObject).ObjectFlags & 0x20) != 0)) {
        __assert_fail("node->NextThinker != NULL && !(node->NextThinker->ObjectFlags & OF_EuthanizeMe)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                      ,0x8f,"static void DThinker::SaveList(FSerializer &, DThinker *)");
      }
      local_18 = node;
      ::Serialize(arc,(char *)0x0,(DObject **)&local_18,(DObject **)0x0,(bool *)0x0);
      node = local_18->NextThinker;
      bVar1 = *(byte *)((long)&(node->super_DObject).ObjectFlags + 1);
    }
  }
  return;
}

Assistant:

void DThinker::SaveList(FSerializer &arc, DThinker *node)
{
	if (node != NULL)
	{
		while (!(node->ObjectFlags & OF_Sentinel))
		{
			assert(node->NextThinker != NULL && !(node->NextThinker->ObjectFlags & OF_EuthanizeMe));
			::Serialize<DThinker>(arc, nullptr, node, nullptr);
			node = node->NextThinker;
		}
	}
}